

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# efsw-test.cpp
# Opt level: O0

void __thiscall
UpdateListener::handleFileAction
          (UpdateListener *this,WatchID watchid,string *dir,string *filename,Action action,
          string *oldFilename)

{
  ostream *poVar1;
  ulong uVar2;
  UpdateListener local_138 [4];
  byte local_111;
  string local_110 [54];
  byte local_da;
  allocator local_d9;
  string local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  string *local_38;
  string *oldFilename_local;
  string *psStack_28;
  Action action_local;
  string *filename_local;
  string *dir_local;
  WatchID watchid_local;
  UpdateListener *this_local;
  
  local_38 = oldFilename;
  oldFilename_local._4_4_ = action;
  psStack_28 = filename;
  filename_local = dir;
  dir_local = (string *)watchid;
  watchid_local = (WatchID)this;
  poVar1 = std::operator<<((ostream *)&std::cout,"Watch ID ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(long)dir_local);
  poVar1 = std::operator<<(poVar1," DIR (");
  std::operator+(local_b8,(char *)filename_local);
  uVar2 = std::__cxx11::string::empty();
  local_da = 0;
  local_111 = 0;
  if ((uVar2 & 1) == 0) {
    std::operator+((char *)local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"from file "
                  );
    local_111 = 1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   (char *)local_110);
  }
  else {
    std::allocator<char>::allocator();
    local_da = 1;
    std::__cxx11::string::string(local_d8,"",&local_d9);
  }
  std::operator+(local_98,local_b8);
  std::operator+(local_78,local_98);
  std::operator+(local_58,(char *)local_78);
  poVar1 = std::operator<<(poVar1,(string *)local_58);
  getActionName_abi_cxx11_(local_138,(Action)this);
  poVar1 = std::operator<<(poVar1,(string *)local_138);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_138);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string(local_d8);
  if ((local_111 & 1) != 0) {
    std::__cxx11::string::~string(local_110);
  }
  if ((local_da & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  }
  std::__cxx11::string::~string((string *)local_b8);
  return;
}

Assistant:

void handleFileAction( efsw::WatchID watchid, const std::string& dir,
						   const std::string& filename, efsw::Action action,
						   std::string oldFilename = "" ) override {
		std::cout << "Watch ID " << watchid << " DIR ("
				  << dir + ") FILE (" +
						 ( oldFilename.empty() ? "" : "from file " + oldFilename + " to " ) +
						 filename + ") has event "
				  << getActionName( action ) << std::endl;
	}